

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

void dump_FMfield_as_XML(FMContext c,FMFormat_conflict format,int field,void *data,void *string_base
                        ,int encode,int verbose)

{
  ffs_dstring ds;
  char *pcVar1;
  
  ds = (ffs_dstring)ffs_malloc(0x10);
  pcVar1 = (char *)ffs_malloc(0x40);
  ds->string = pcVar1;
  *pcVar1 = '\0';
  ds->length = 0;
  ds->max_alloc = 0x40;
  generic_field_to_XML(format,field,data,string_base,encode,ds);
  printf("%s",ds->string);
  free(ds->string);
  free(ds);
  return;
}

Assistant:

extern void
dump_FMfield_as_XML(FMContext c, FMFormat format, int field, void *data,
		    void *string_base, int encode, int verbose)
{
    ffs_dstring ds = new_dstring();
    generic_field_to_XML(format, field, data, string_base, encode,
			 ds);
    printf("%s", ds->string);
    free(ds->string);
    free(ds);
}